

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFS.h
# Opt level: O0

bool dg::pta::PointerAnalysisFS::mergeObjects
               (PSNode *node,MemoryObject *to,MemoryObject *from,PointsToSetT *overwritten)

{
  bool bVar1;
  size_t sVar2;
  Pointer *in_RCX;
  long in_RDX;
  Offset this;
  PSNode *in_RDI;
  Pointer PVar3;
  Pointer *ptr;
  const_iterator __end3;
  const_iterator __begin3;
  PointerIdPointsToSet *__range3;
  mapped_type *S;
  pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet> *fromIt;
  iterator __end2;
  iterator __begin2;
  PointsToMapT *__range2;
  bool changed;
  Pointer *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 uVar4;
  Pointer *in_stack_ffffffffffffff60;
  PointerIdPointsToSet *in_stack_ffffffffffffff68;
  key_type *in_stack_ffffffffffffff78;
  map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
  *in_stack_ffffffffffffff80;
  Pointer local_58;
  reference local_48;
  _Self local_40;
  _Self local_38;
  long local_30;
  byte local_21;
  Pointer *local_20;
  PSNode *local_8;
  
  local_21 = 0;
  local_30 = in_RDX + 8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
       ::begin((map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
                *)in_stack_ffffffffffffff38);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
       ::end((map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
              *)in_stack_ffffffffffffff38);
  while (bVar1 = std::operator!=(&local_38,&local_40), bVar1) {
    local_48 = std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::
               operator*((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>
                          *)0x19db98);
    uVar4 = false;
    if (local_20 != (Pointer *)0x0) {
      in_stack_ffffffffffffff38 = local_20;
      Pointer::Pointer(&local_58,local_8,(Offset)(local_48->first).offset);
      sVar2 = PointerIdPointsToSet::count
                        ((PointerIdPointsToSet *)CONCAT17(uVar4,in_stack_ffffffffffffff40),
                         in_stack_ffffffffffffff38);
      uVar4 = sVar2 != 0;
    }
    if ((bool)uVar4 == false) {
      std::
      map<dg::Offset,_dg::pta::PointerIdPointsToSet,_std::less<dg::Offset>,_std::allocator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>_>
      ::operator[](in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      PointerIdPointsToSet::begin((PointerIdPointsToSet *)CONCAT17(uVar4,in_stack_ffffffffffffff40))
      ;
      PointerIdPointsToSet::end((PointerIdPointsToSet *)CONCAT17(uVar4,in_stack_ffffffffffffff40));
      while (bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                               ((const_iterator *)CONCAT17(uVar4,in_stack_ffffffffffffff40),
                                (const_iterator *)in_stack_ffffffffffffff38), bVar1) {
        PVar3 = PointerIdPointsToSet::const_iterator::operator*
                          ((const_iterator *)in_stack_ffffffffffffff38);
        this = PVar3.offset.offset;
        bVar1 = PointerIdPointsToSet::add(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        local_21 = (local_21 & 1) != 0 || bVar1;
        PointerIdPointsToSet::const_iterator::operator++((const_iterator *)this.offset);
      }
    }
    std::_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_dg::Offset,_dg::pta::PointerIdPointsToSet>_> *)
               CONCAT17(uVar4,in_stack_ffffffffffffff40));
  }
  return (bool)(local_21 & 1);
}

Assistant:

static bool mergeObjects(PSNode *node, MemoryObject *to, MemoryObject *from,
                             PointsToSetT *overwritten) {
        bool changed = false;

        for (auto &fromIt : from->pointsTo) {
            if (overwritten && overwritten->count(Pointer(node, fromIt.first)))
                continue;

            auto &S = to->pointsTo[fromIt.first];
            for (const auto &ptr : fromIt.second)
                changed |= S.add(ptr);
        }

        return changed;
    }